

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxRuntime.cpp
# Opt level: O0

bool __thiscall Jinx::Impl::Runtime::PropertyExists(Runtime *this,RuntimeID id)

{
  bool bVar1;
  _Self local_40 [3];
  _Self local_28;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lock;
  RuntimeID id_local;
  Runtime *this_local;
  
  lock._M_device = (mutex_type *)id;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->m_propertyMutex);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_Jinx::Variant,_std::less<unsigned_long>,_Jinx::StaticAllocator<std::pair<const_unsigned_long,_Jinx::Variant>,_4096UL,_16UL>_>
       ::find(&this->m_propertyMap,(key_type_conflict *)&lock);
  local_40[0]._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_Jinx::Variant,_std::less<unsigned_long>,_Jinx::StaticAllocator<std::pair<const_unsigned_long,_Jinx::Variant>,_4096UL,_16UL>_>
       ::end(&this->m_propertyMap);
  bVar1 = std::operator!=(&local_28,local_40);
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return bVar1;
}

Assistant:

inline_t bool Runtime::PropertyExists(RuntimeID id) const
	{
		std::lock_guard<std::mutex> lock(m_propertyMutex);
		return m_propertyMap.find(id) != m_propertyMap.end();
	}